

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_read_key
              (mbedtls_ecp_group_id grp_id,mbedtls_ecp_keypair *key,uchar *buf,size_t buflen)

{
  int iVar1;
  mbedtls_ecp_curve_type mVar2;
  int local_2c;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_ecp_keypair *key_local;
  mbedtls_ecp_group_id grp_id_local;
  
  iVar1 = mbedtls_ecp_group_load(&key->grp,grp_id);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_2c = -0x4e80;
  mVar2 = mbedtls_ecp_get_type(&key->grp);
  if (mVar2 == MBEDTLS_ECP_TYPE_MONTGOMERY) {
    if (grp_id == MBEDTLS_ECP_DP_CURVE25519) {
      if (buflen != 0x20) {
        return -0x4c80;
      }
      local_2c = mbedtls_mpi_read_binary_le(&key->d,buf,0x20);
      if (((((local_2c != 0) || (local_2c = mbedtls_mpi_set_bit(&key->d,0,'\0'), local_2c != 0)) ||
           (local_2c = mbedtls_mpi_set_bit(&key->d,1,'\0'), local_2c != 0)) ||
          ((local_2c = mbedtls_mpi_set_bit(&key->d,2,'\0'), local_2c != 0 ||
           (local_2c = mbedtls_mpi_set_bit(&key->d,0xff,'\0'), local_2c != 0)))) ||
         (local_2c = mbedtls_mpi_set_bit(&key->d,0xfe,'\x01'), local_2c != 0)) goto LAB_0014014e;
    }
    else {
      local_2c = -0x4e80;
    }
  }
  mVar2 = mbedtls_ecp_get_type(&key->grp);
  if ((mVar2 == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) &&
     (local_2c = mbedtls_mpi_read_binary(&key->d,buf,buflen), local_2c == 0)) {
    local_2c = mbedtls_ecp_check_privkey(&key->grp,&key->d);
  }
LAB_0014014e:
  if (local_2c != 0) {
    mbedtls_mpi_free(&key->d);
  }
  return local_2c;
}

Assistant:

int mbedtls_ecp_read_key( mbedtls_ecp_group_id grp_id, mbedtls_ecp_keypair *key,
                          const unsigned char *buf, size_t buflen )
{
    int ret = 0;

    ECP_VALIDATE_RET( key  != NULL );
    ECP_VALIDATE_RET( buf  != NULL );

    if( ( ret = mbedtls_ecp_group_load( &key->grp, grp_id ) ) != 0 )
        return( ret );

    ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( &key->grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
    {
        /*
         * If it is Curve25519 curve then mask the key as mandated by RFC7748
         */
        if( grp_id == MBEDTLS_ECP_DP_CURVE25519 )
        {
            if( buflen != ECP_CURVE25519_KEY_SIZE )
                return MBEDTLS_ERR_ECP_INVALID_KEY;

            MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary_le( &key->d, buf, buflen ) );

            /* Set the three least significant bits to 0 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &key->d, 0, 0 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &key->d, 1, 0 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &key->d, 2, 0 ) );

            /* Set the most significant bit to 0 */
            MBEDTLS_MPI_CHK(
                    mbedtls_mpi_set_bit( &key->d,
                                         ECP_CURVE25519_KEY_SIZE * 8 - 1, 0 )
                    );

            /* Set the second most significant bit to 1 */
            MBEDTLS_MPI_CHK(
                    mbedtls_mpi_set_bit( &key->d,
                                         ECP_CURVE25519_KEY_SIZE * 8 - 2, 1 )
                    );
        }
        else
            ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    }

#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( &key->grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &key->d, buf, buflen ) );

        MBEDTLS_MPI_CHK( mbedtls_ecp_check_privkey( &key->grp, &key->d ) );
    }

#endif
cleanup:

    if( ret != 0 )
        mbedtls_mpi_free( &key->d );

    return( ret );
}